

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

QRectF * __thiscall
QTextDocumentLayoutPrivate::frameBoundingRectInternal
          (QRectF *__return_storage_ptr__,QTextDocumentLayoutPrivate *this,QTextFrame *frame)

{
  QFixedPoint QVar1;
  _func_int **pp_Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QFixed QVar7;
  QFixed QVar8;
  QTextTableData *this_00;
  long lVar9;
  QTextTable *table;
  QTextFrame *this_01;
  QTextFrameLayoutData *data;
  long in_FS_OFFSET;
  double local_78;
  double dStack_70;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextFrame::firstPosition(frame);
  local_78 = 0.0;
  dStack_70 = 0.0;
  this_01 = frame;
  do {
    this_00 = (QTextTableData *)QTextFrame::layoutData(this_01);
    if (this_00 == (QTextTableData *)0x0) {
      lVar9 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
      if (lVar9 == 0) {
        this_00 = (QTextTableData *)operator_new(0x78);
        (this_00->super_QTextFrameData).super_QTextFrameLayoutData._vptr_QTextFrameLayoutData =
             (_func_int **)&PTR__QTextFrameData_007dcf10;
        (this_00->super_QTextFrameData).position.x = 0;
        (this_00->super_QTextFrameData).position.y = 0;
        (this_00->super_QTextFrameData).size.width = 0;
        (this_00->super_QTextFrameData).size.height = 0;
        (this_00->super_QTextFrameData).topMargin = 0;
        (this_00->super_QTextFrameData).bottomMargin = 0;
        (this_00->super_QTextFrameData).leftMargin = 0;
        (this_00->super_QTextFrameData).rightMargin = 0;
        (this_00->super_QTextFrameData).border = 0;
        (this_00->super_QTextFrameData).padding = 0;
        (this_00->super_QTextFrameData).contentsWidth = 0;
        (this_00->super_QTextFrameData).contentsHeight = 0;
        (this_00->super_QTextFrameData).oldContentsWidth = 0;
        (this_00->super_QTextFrameData).effectiveTopMargin = 0;
        (this_00->super_QTextFrameData).effectiveBottomMargin = 0;
        (this_00->super_QTextFrameData).minimumWidth = 0;
        (this_00->super_QTextFrameData).maximumWidth.val = 0x1fffffc0;
        (this_00->super_QTextFrameData).currentLayoutStruct = (QTextLayoutStruct *)0x0;
        (this_00->super_QTextFrameData).sizeDirty = true;
        (this_00->super_QTextFrameData).layoutDirty = true;
        (this_00->super_QTextFrameData).floats.d.d = (Data *)0x0;
        (this_00->super_QTextFrameData).floats.d.ptr = (QPointer<QTextFrame> *)0x0;
        (this_00->super_QTextFrameData).floats.d.size = 0;
      }
      else {
        this_00 = (QTextTableData *)operator_new(0x160);
        (this_00->super_QTextFrameData).position.x = 0;
        (this_00->super_QTextFrameData).position.y = 0;
        (this_00->super_QTextFrameData).size.width = 0;
        (this_00->super_QTextFrameData).size.height = 0;
        (this_00->super_QTextFrameData).topMargin = 0;
        (this_00->super_QTextFrameData).bottomMargin = 0;
        (this_00->super_QTextFrameData).leftMargin = 0;
        (this_00->super_QTextFrameData).rightMargin = 0;
        (this_00->super_QTextFrameData).border = 0;
        (this_00->super_QTextFrameData).padding = 0;
        (this_00->super_QTextFrameData).contentsWidth = 0;
        (this_00->super_QTextFrameData).contentsHeight = 0;
        (this_00->super_QTextFrameData).oldContentsWidth = 0;
        (this_00->super_QTextFrameData).effectiveTopMargin = 0;
        (this_00->super_QTextFrameData).effectiveBottomMargin = 0;
        (this_00->super_QTextFrameData).minimumWidth = 0;
        (this_00->super_QTextFrameData).maximumWidth.val = 0x1fffffc0;
        (this_00->super_QTextFrameData).currentLayoutStruct = (QTextLayoutStruct *)0x0;
        (this_00->super_QTextFrameData).sizeDirty = true;
        (this_00->super_QTextFrameData).layoutDirty = true;
        (this_00->super_QTextFrameData).floats.d.d = (Data *)0x0;
        (this_00->super_QTextFrameData).floats.d.ptr = (QPointer<QTextFrame> *)0x0;
        (this_00->super_QTextFrameData).floats.d.size = 0;
        this_00->cellSpacing = 0;
        this_00->cellPadding = 0;
        (this_00->super_QTextFrameData).super_QTextFrameLayoutData._vptr_QTextFrameLayoutData =
             (_func_int **)&PTR__QTextTableData_007dd0c0;
        (this_00->childFrameMap).d = (Data *)0x0;
        (this_00->childFrameMap).m_size = 0;
        memset(&this_00->minWidths,0,0xc0);
      }
      QTextFrame::setLayoutData(this_01,(QTextFrameLayoutData *)this_00);
    }
    QVar1 = (this_00->super_QTextFrameData).position;
    local_78 = local_78 + (double)QVar1.x.val.val * 0.015625;
    dStack_70 = dStack_70 + (double)QVar1.y.val.val * 0.015625;
    table = (QTextTable *)QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (table != (QTextTable *)0x0) {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt((QTextTable *)local_48,(int)table);
      if ((QTextTable *)local_48._0_8_ != (QTextTable *)0x0) {
        iVar5 = QTextTableCell::row((QTextTableCell *)local_48);
        iVar6 = QTextTableCell::column((QTextTableCell *)local_48);
        iVar3 = (this_00->rowPositions).d.ptr[iVar5].val;
        iVar4 = (this_00->cellVerticalOffsets).d.ptr
                [(this_00->widths).d.size * (long)iVar5 + (long)iVar6].val;
        iVar5 = (this_00->columnPositions).d.ptr[iVar6].val;
        QVar7 = QTextTableData::leftPadding(this_00,table,(QTextTableCell *)local_48);
        QVar8 = QTextTableData::topPadding(this_00,table,(QTextTableCell *)local_48);
        local_78 = local_78 + (double)(iVar5 + QVar7.val) * 0.015625;
        dStack_70 = dStack_70 + (double)(QVar8.val + iVar3 + iVar4) * 0.015625;
      }
    }
    this_01 = QTextFrame::parentFrame(this_01);
  } while (this_01 != (QTextFrame *)0x0);
  data = QTextFrame::layoutData(frame);
  if (data == (QTextFrameLayoutData *)0x0) {
    lVar9 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (lVar9 == 0) {
      data = (QTextFrameLayoutData *)operator_new(0x78);
      data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
      data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
      data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
    }
    else {
      data = (QTextFrameLayoutData *)operator_new(0x160);
      data[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
      data[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
      data[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      data[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      memset(data + 0x11,0,0xc0);
    }
    QTextFrame::setLayoutData(frame,data);
  }
  __return_storage_ptr__->xp = local_78;
  __return_storage_ptr__->yp = dStack_70;
  pp_Var2 = data[2]._vptr_QTextFrameLayoutData;
  __return_storage_ptr__->w = (double)(int)pp_Var2 * 0.015625;
  __return_storage_ptr__->h = (double)(int)((ulong)pp_Var2 >> 0x20) * 0.015625;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QTextDocumentLayoutPrivate::frameBoundingRectInternal(QTextFrame *frame) const
{
    QPointF pos;
    const int framePos = frame->firstPosition();
    QTextFrame *f = frame;
    while (f) {
        QTextFrameData *fd = data(f);
        pos += fd->position.toPointF();

        if (QTextTable *table = qobject_cast<QTextTable *>(f)) {
            QTextTableCell cell = table->cellAt(framePos);
            if (cell.isValid())
                pos += static_cast<QTextTableData *>(fd)->cellPosition(table, cell).toPointF();
        }

        f = f->parentFrame();
    }
    return QRectF(pos, data(frame)->size.toSizeF());
}